

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_bmp.c
# Opt level: O3

gdImagePtr gdImageCreateFromBmpCtx(gdIOCtxPtr infile)

{
  int iVar1;
  bmp_info_t *header;
  bmp_info_t *info;
  gdImagePtr im;
  ushort uVar2;
  uint sy;
  bool bVar3;
  char useless_bytes [24];
  int *local_58;
  int *local_50;
  undefined1 local_48 [24];
  
  header = (bmp_info_t *)gdCalloc(1,0x10);
  if (header == (bmp_info_t *)0x0) {
    return (gdImagePtr)0x0;
  }
  iVar1 = gdGetWordLSB((short *)header,infile);
  if (((((iVar1 == 0) || (iVar1 = gdGetIntLSB(&header->len,infile), iVar1 == 0)) ||
       (iVar1 = gdGetWordLSB((short *)&header->width,infile), iVar1 == 0)) ||
      ((iVar1 = gdGetWordLSB((short *)((long)&header->width + 2),infile), iVar1 == 0 ||
       (iVar1 = gdGetIntLSB(&header->height,infile), iVar1 == 0)))) ||
     ((header->type != 0x4d42 || (info = (bmp_info_t *)gdCalloc(1,0x30), info == (bmp_info_t *)0x0))
     )) goto LAB_00111ea0;
  iVar1 = gdGetIntLSB(&info->len,infile);
  if (iVar1 != 0) {
    iVar1 = info->len;
    if (iVar1 < 0x40) {
      if (iVar1 == 0xc) {
        iVar1 = gdGetWordLSB((short *)&info->width,infile);
        if (iVar1 != 0) {
          iVar1 = gdGetWordLSB((short *)&info->height,infile);
          if (iVar1 != 0) {
            iVar1 = gdGetWordLSB(&info->numplanes,infile);
            if ((iVar1 != 0) && (iVar1 = gdGetWordLSB(&info->depth,infile), iVar1 != 0)) {
              info->topdown = '\0';
              uVar2 = info->depth;
              if ((uVar2 < 0x19) && ((0x1010112U >> (uVar2 & 0x1f) & 1) != 0)) {
                info->numcolors = 1 << ((byte)uVar2 & 0x1f);
                info->type = 1;
                iVar1 = info->width;
                if (((0 < iVar1) && (sy = info->height, 0 < (int)sy)) && (0 < info->numplanes))
                goto LAB_0011216a;
              }
            }
          }
        }
      }
      else if (iVar1 == 0x28) goto LAB_00111ecc;
    }
    else if (iVar1 == 0x40) {
      iVar1 = gdGetIntLSB(&info->width,infile);
      if (((((iVar1 != 0) && (iVar1 = gdGetIntLSB(&info->height,infile), iVar1 != 0)) &&
           ((iVar1 = gdGetWordLSB(&info->numplanes,infile), iVar1 != 0 &&
            ((iVar1 = gdGetWordLSB(&info->depth,infile), iVar1 != 0 &&
             (iVar1 = gdGetIntLSB(&info->enctype,infile), iVar1 != 0)))))) &&
          ((iVar1 = gdGetIntLSB(&info->size,infile), iVar1 != 0 &&
           (((iVar1 = gdGetIntLSB(&info->hres,infile), iVar1 != 0 &&
             (iVar1 = gdGetIntLSB(&info->vres,infile), iVar1 != 0)) &&
            (iVar1 = gdGetIntLSB(&info->numcolors,infile), iVar1 != 0)))))) &&
         (iVar1 = gdGetIntLSB(&info->mincolors,infile), iVar1 != 0)) {
        iVar1 = gdGetBuf(local_48,0x18,infile);
LAB_00111fa1:
        local_50 = &info->numcolors;
        local_58 = &info->mincolors;
        if ((iVar1 != 0) && (sy = info->height, (sy & 0x7fffffff) != 0)) {
          bVar3 = (int)sy < 0;
          if (bVar3) {
            sy = -sy;
            info->height = sy;
          }
          info->topdown = bVar3;
          info->type = 2;
          iVar1 = info->width;
          if ((((0 < iVar1) && (0 < info->numplanes)) && (uVar2 = info->depth, 0 < (short)uVar2)) &&
             ((-1 < *local_50 && (-1 < *local_58)))) {
LAB_0011216a:
            if (uVar2 < 0x10) {
              im = gdImageCreate(iVar1,sy);
            }
            else {
              im = gdImageCreateTrueColor(iVar1,sy);
            }
            if (im != (gdImagePtr)0x0) {
              uVar2 = info->depth;
              iVar1 = 1;
              if (uVar2 < 0x10) {
                if (uVar2 == 1) {
                  iVar1 = bmp_read_1bit(im,infile,info,(bmp_hdr_t *)header);
                }
                else if (uVar2 == 4) {
                  iVar1 = bmp_read_4bit(im,infile,info,(bmp_hdr_t *)header);
                }
                else if (uVar2 == 8) {
                  iVar1 = bmp_read_8bit(im,infile,info,(bmp_hdr_t *)header);
                }
              }
              else if (((uVar2 == 0x10) || (uVar2 == 0x18)) || (uVar2 == 0x20)) {
                iVar1 = bmp_read_direct(im,infile,info,(bmp_hdr_t *)header);
              }
              gdFree(header);
              gdFree(info);
              if (iVar1 != 0) {
                gdImageDestroy(im);
                return (gdImagePtr)0x0;
              }
              return im;
            }
          }
        }
      }
    }
    else if ((iVar1 == 0x7c) || (iVar1 == 0x6c)) {
LAB_00111ecc:
      iVar1 = gdGetIntLSB(&info->width,infile);
      if ((((iVar1 != 0) &&
           ((iVar1 = gdGetIntLSB(&info->height,infile), iVar1 != 0 &&
            (iVar1 = gdGetWordLSB(&info->numplanes,infile), iVar1 != 0)))) &&
          (iVar1 = gdGetWordLSB(&info->depth,infile), iVar1 != 0)) &&
         ((((iVar1 = gdGetIntLSB(&info->enctype,infile), iVar1 != 0 &&
            (iVar1 = gdGetIntLSB(&info->size,infile), iVar1 != 0)) &&
           (iVar1 = gdGetIntLSB(&info->hres,infile), iVar1 != 0)) &&
          ((iVar1 = gdGetIntLSB(&info->vres,infile), iVar1 != 0 &&
           (iVar1 = gdGetIntLSB(&info->numcolors,infile), iVar1 != 0)))))) {
        iVar1 = gdGetIntLSB(&info->mincolors,infile);
        goto LAB_00111fa1;
      }
    }
  }
  gdFree(header);
  header = info;
LAB_00111ea0:
  gdFree(header);
  return (gdImagePtr)0x0;
}

Assistant:

BGD_DECLARE(gdImagePtr) gdImageCreateFromBmpCtx(gdIOCtxPtr infile)
{
	bmp_hdr_t *hdr;
	bmp_info_t *info;
	gdImagePtr im = NULL;
	int error = 0;

	if (!(hdr= (bmp_hdr_t *)gdCalloc(1, sizeof(bmp_hdr_t)))) {
		return NULL;
	}

	if (bmp_read_header(infile, hdr)) {
		gdFree(hdr);
		return NULL;
	}

	if (hdr->magic != 0x4d42) {
		gdFree(hdr);
		return NULL;
	}

	if (!(info = (bmp_info_t *)gdCalloc(1, sizeof(bmp_info_t)))) {
		gdFree(hdr);
		return NULL;
	}

	if (bmp_read_info(infile, info)) {
		gdFree(hdr);
		gdFree(info);
		return NULL;
	}

	BMP_DEBUG(printf("Numcolours: %d\n", info->numcolors));
	BMP_DEBUG(printf("Width: %d\n", info->width));
	BMP_DEBUG(printf("Height: %d\n", info->height));
	BMP_DEBUG(printf("Planes: %d\n", info->numplanes));
	BMP_DEBUG(printf("Depth: %d\n", info->depth));
	BMP_DEBUG(printf("Offset: %d\n", hdr->off));

	if (info->depth >= 16) {
		im = gdImageCreateTrueColor(info->width, info->height);
	} else {
		im = gdImageCreate(info->width, info->height);
	}

	if (!im) {
		gdFree(hdr);
		gdFree(info);
		return NULL;
	}

	switch (info->depth) {
	case 1:
		BMP_DEBUG(printf("1-bit image\n"));
		error = bmp_read_1bit(im, infile, info, hdr);
		break;
	case 4:
		BMP_DEBUG(printf("4-bit image\n"));
		error = bmp_read_4bit(im, infile, info, hdr);
		break;
	case 8:
		BMP_DEBUG(printf("8-bit image\n"));
		error = bmp_read_8bit(im, infile, info, hdr);
		break;
	case 16:
	case 24:
	case 32:
		BMP_DEBUG(printf("Direct BMP image\n"));
		error = bmp_read_direct(im, infile, info, hdr);
		break;
	default:
		BMP_DEBUG(printf("Unknown bit count\n"));
		error = 1;
	}

	gdFree(hdr);
	gdFree(info);

	if (error) {
		gdImageDestroy(im);
		return NULL;
	}

	return im;
}